

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat4 *matrixArray,size_t length)

{
  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *p_Var1;
  string *name_00;
  reference pvVar2;
  ulong in_RCX;
  long in_RDX;
  size_type in_RDI;
  UniformBinder binder;
  size_t i;
  vector<float,_std::allocator<float>_> contiguous;
  size_t matrixSize;
  uint in_stack_000000ac;
  char *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  GLsizei in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  allocator_type *in_stack_ffffffffffffff70;
  Shader *shader;
  UniformBinder *in_stack_ffffffffffffff90;
  int local_64;
  ulong local_60;
  undefined1 local_41 [25];
  undefined8 local_28;
  ulong local_20;
  long local_18;
  
  local_28 = 0x10;
  name_00 = (string *)(in_RCX << 4);
  shader = (Shader *)local_41;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<float>::allocator((allocator<float> *)0x15dae0);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)name_00,in_RDI,in_stack_ffffffffffffff70);
  std::allocator<float>::~allocator((allocator<float> *)0x15db00);
  for (local_60 = 0; local_60 < local_20; local_60 = local_60 + 1) {
    in_stack_ffffffffffffff70 = (allocator_type *)(local_18 + local_60 * 0x40);
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)(local_41 + 1),local_60 << 4);
    priv::copyMatrix((float *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(float *)0x15db58
                    );
  }
  UniformBinder::UniformBinder(in_stack_ffffffffffffff90,shader,name_00);
  p_Var1 = sf_ptrc_glUniformMatrix4fvARB;
  if (local_64 != -1) {
    in_stack_ffffffffffffff64 = 0;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_41 + 1),0);
    (*p_Var1)(local_64,(GLsizei)local_20,(GLboolean)in_stack_ffffffffffffff64,pvVar2);
    priv::glCheckError(in_stack_000000b0,in_stack_000000ac,(char *)this);
    in_stack_ffffffffffffff60 = (GLsizei)local_20;
  }
  UniformBinder::~UniformBinder
            ((UniformBinder *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat4* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 4 * 4;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix4fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0]));
}